

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::SharedDtor(ConvolutionLayerParams *this)

{
  WeightParams *pWVar1;
  bool bVar2;
  Arena *pAVar3;
  LogMessage *other;
  ConvolutionLayerParams *pCVar4;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  ConvolutionLayerParams *local_10;
  ConvolutionLayerParams *this_local;
  
  local_10 = this;
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar3 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x5b2e);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pCVar4 = internal_default_instance();
  if ((this != pCVar4) && (pWVar1 = this->weights_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pCVar4 = internal_default_instance();
  if ((this != pCVar4) && (pWVar1 = this->bias_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  bVar2 = has_ConvolutionPaddingType(this);
  if (bVar2) {
    clear_ConvolutionPaddingType(this);
  }
  return;
}

Assistant:

inline void ConvolutionLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete weights_;
  if (this != internal_default_instance()) delete bias_;
  if (has_ConvolutionPaddingType()) {
    clear_ConvolutionPaddingType();
  }
}